

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  int64 iVar5;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  Extension *local_38;
  Extension *extension;
  Arena *message_arena;
  MessageLite *message_local;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  message_arena = (Arena *)message;
  message_local = (MessageLite *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_10 = this;
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
  }
  else {
    iVar2 = (*message->_vptr_MessageLite[5])();
    extension = (Extension *)CONCAT44(extraout_var,iVar2);
    bVar1 = MaybeNewExtension(this,descriptor_local._4_4_,(FieldDescriptor *)message_local,&local_38
                             );
    if (bVar1) {
      local_38->type = descriptor_local._3_1_;
      CVar3 = anon_unknown_29::cpp_type(local_38->type);
      local_71 = 0;
      if (CVar3 != CPPTYPE_MESSAGE) {
        LogMessage::LogMessage
                  (&local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x25b);
        local_71 = 1;
        pLVar4 = LogMessage::operator<<
                           (&local_70,
                            "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                           );
        LogFinisher::operator=(local_85,pLVar4);
      }
      if ((local_71 & 1) != 0) {
        LogMessage::~LogMessage(&local_70);
      }
      local_38->is_repeated = false;
      local_38->field_0xa = local_38->field_0xa & 0xf;
      if (extension == (Extension *)this->arena_) {
        (local_38->field_0).string_value = (string *)message_arena;
      }
      else if (extension == (Extension *)0x0) {
        (local_38->field_0).string_value = (string *)message_arena;
        Arena::Own<google::protobuf::MessageLite>(this->arena_,(MessageLite *)message_arena);
      }
      else {
        iVar5 = (**(code **)(*(long *)message_arena + 0x20))(message_arena,this->arena_);
        (local_38->field_0).int64_value = iVar5;
        (**(code **)((((local_38->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                     arena_ + 0x50))((local_38->field_0).repeated_string_value,message_arena);
      }
    }
    else {
      local_c1 = 0;
      if ((local_38->is_repeated & 1U) != 0) {
        LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x268);
        local_c1 = 1;
        pLVar4 = LogMessage::operator<<
                           (&local_c0,
                            "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                           );
        LogFinisher::operator=(&local_c2,pLVar4);
      }
      if ((local_c1 & 1) != 0) {
        LogMessage::~LogMessage(&local_c0);
      }
      CVar3 = anon_unknown_29::cpp_type(local_38->type);
      local_101 = 0;
      if (CVar3 != CPPTYPE_MESSAGE) {
        LogMessage::LogMessage
                  (&local_100,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x268);
        local_101 = 1;
        pLVar4 = LogMessage::operator<<
                           (&local_100,
                            "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                           );
        LogFinisher::operator=(&local_102,pLVar4);
      }
      if ((local_101 & 1) != 0) {
        LogMessage::~LogMessage(&local_100);
      }
      if (((byte)local_38->field_0xa >> 4 & 1) == 0) {
        if ((this->arena_ == (Arena *)0x0) &&
           ((local_38->field_0).repeated_string_value !=
            (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0)) {
          (**(code **)((((local_38->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                       arena_ + 8))();
        }
        if (extension == (Extension *)this->arena_) {
          (local_38->field_0).string_value = (string *)message_arena;
        }
        else if (extension == (Extension *)0x0) {
          (local_38->field_0).string_value = (string *)message_arena;
          Arena::Own<google::protobuf::MessageLite>(this->arena_,(MessageLite *)message_arena);
        }
        else {
          iVar5 = (**(code **)(*(long *)message_arena + 0x20))(message_arena,this->arena_);
          (local_38->field_0).int64_value = iVar5;
          (**(code **)((((local_38->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                       arena_ + 0x50))((local_38->field_0).repeated_string_value,message_arena);
        }
      }
      else {
        (**(code **)((((local_38->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                     arena_ + 0x28))((local_38->field_0).repeated_string_value,message_arena);
      }
    }
    local_38->field_0xa = local_38->field_0xa & 0xf0;
  }
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  ::google::protobuf::Arena* message_arena = message->GetArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == NULL) {
      extension->message_value = message;
      arena_->Own(message);  // not NULL because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == NULL) {
        extension->message_value = message;
        arena_->Own(message);  // not NULL because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}